

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O1

void __thiscall hmac_hash::SHA512::transform(SHA512 *this,uint8_t *message,size_t block_nb)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  uint64_t uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  uint64_t local_318 [5];
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong auStack_2b8 [81];
  
  if (block_nb != 0) {
    puVar8 = message + 7;
    sVar5 = 0;
    do {
      lVar4 = 0;
      do {
        uVar1 = *(ulong *)(puVar8 + lVar4 * 8 + -7);
        auStack_2b8[lVar4] =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      lVar4 = 0;
      do {
        uVar1 = auStack_2b8[lVar4 + 0xe];
        uVar2 = auStack_2b8[lVar4 + 1];
        auStack_2b8[lVar4 + 0x10] =
             (uVar1 >> 6 ^ (uVar1 << 3 | uVar1 >> 0x3d) ^ (uVar1 << 0x2d | uVar1 >> 0x13)) +
             auStack_2b8[lVar4 + 9] + auStack_2b8[lVar4] +
             (uVar2 >> 7 ^
             (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f));
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
      local_2e8 = this->m_h[6];
      uStack_2e0 = this->m_h[7];
      local_318[4] = this->m_h[4];
      uStack_2f0 = this->m_h[5];
      local_318[0] = this->m_h[0];
      local_318[1] = this->m_h[1];
      local_318[2] = this->m_h[2];
      local_318[3] = this->m_h[3];
      lVar4 = 0;
      uVar1 = this->m_h[6];
      uVar2 = this->m_h[5];
      uVar7 = this->m_h[3];
      uVar3 = this->m_h[2];
      uVar9 = this->m_h[7];
      do {
        local_318[2] = local_318[1];
        local_318[1] = local_318[0];
        local_318[3] = uVar3;
        uStack_2f0 = local_318[4];
        local_2e8 = uVar2;
        uStack_2e0 = uVar1;
        lVar6 = ((uStack_2f0 << 0x17 | uStack_2f0 >> 0x29) ^
                (uStack_2f0 << 0x2e | uStack_2f0 >> 0x12) ^ (uStack_2f0 << 0x32 | uStack_2f0 >> 0xe)
                ) + uVar9 + *(long *)((long)&sha512_k + lVar4) +
                ((local_2e8 ^ uStack_2e0) & uStack_2f0 ^ uStack_2e0) +
                *(long *)((long)auStack_2b8 + lVar4);
        local_318[4] = uVar7 + lVar6;
        local_318[0] = (local_318[3] & local_318[2] ^ (local_318[3] ^ local_318[2]) & local_318[1])
                       + ((local_318[1] << 0x19 | local_318[1] >> 0x27) ^
                         (local_318[1] << 0x1e | local_318[1] >> 0x22) ^
                         (local_318[1] << 0x24 | local_318[1] >> 0x1c)) + lVar6;
        lVar4 = lVar4 + 8;
        uVar1 = local_2e8;
        uVar2 = uStack_2f0;
        uVar7 = local_318[3];
        uVar3 = local_318[2];
        uVar9 = uStack_2e0;
      } while (lVar4 != 0x280);
      lVar4 = 0;
      do {
        this->m_h[lVar4] = this->m_h[lVar4] + local_318[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      sVar5 = sVar5 + 1;
      puVar8 = puVar8 + 0x80;
    } while (sVar5 != block_nb);
  }
  return;
}

Assistant:

void SHA512::transform(const uint8_t *message, size_t block_nb) {
        uint64_t w[80];
        uint64_t wv[8];
        uint64_t t1, t2;
        const uint8_t *sub_block;
        size_t i, j;
        for(i = 0; i < block_nb; ++i) {
            sub_block = message + (i << 7);
            for(j = 0; j < 16; ++j) {
                SHA2_PACK64(&sub_block[j << 3], &w[j]);
            }
            for(j = 16; j < 80; ++j) {
                w[j] =  SHA512_F4(w[j -  2]) + w[j -  7] + SHA512_F3(w[j - 15]) + w[j - 16];
            }
            for(j = 0; j < 8; ++j) {
                wv[j] = m_h[j];
            }
            for(j = 0; j < 80; ++j) {
                t1 = wv[7] + SHA512_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                    + sha512_k[j] + w[j];
                t2 = SHA512_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
                wv[7] = wv[6];
                wv[6] = wv[5];
                wv[5] = wv[4];
                wv[4] = wv[3] + t1;
                wv[3] = wv[2];
                wv[2] = wv[1];
                wv[1] = wv[0];
                wv[0] = t1 + t2;
            }
            for(j = 0; j < 8; ++j) {
                m_h[j] += wv[j];
            }
        }
    }